

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O1

void __thiscall
SQCompilation::CheckerVisitor::checkFunctionReturns(CheckerVisitor *this,FunctionDecl *func)

{
  byte bVar1;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  char *str;
  char *pcVar6;
  int32_t id;
  FunctionReturnTypeEvaluator local_30;
  
  if (this->effectsOnly != false) {
    return;
  }
  str = func->_name;
  if ((str == (char *)0x0) || (*str == '(')) {
    str = findSlotNameInStack(this,&func->super_Decl);
  }
  local_30.flags = 0;
  local_30.checker = this;
  bVar3 = FunctionReturnTypeEvaluator::checkNode(&local_30,(Statement *)func->_body);
  if (!bVar3) {
    local_30.flags = local_30.flags | 1;
  }
  uVar2 = local_30.flags;
  if ((str == (SQChar *)0x0 || (local_30.flags & 0xfffffcf9) == 0) ||
     (bVar3 = hasAnyPrefix(str,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)SQCompilationContext::
                                  function_should_return_bool_prefix_abi_cxx11_), !bVar3)) {
    bVar1 = 0;
  }
  else {
    report(this,(Node *)func,0x5a,str);
    bVar1 = 1;
  }
  if ((uVar2 & 0xef8) == 0 || (uVar2 & 1) == 0) {
    if ((uVar2 == 0) || (id = 0x4f, (uVar2 & 0xfffff8fc & (uVar2 & 0xfffff8fc) - 1) == 0))
    goto LAB_00157b8f;
  }
  else {
    bVar1 = 1;
    id = 0x4e;
    if ((uVar2 >> 10 & 1) != 0) goto LAB_00157b8f;
  }
  report(this,(Node *)func,id);
  bVar1 = 1;
LAB_00157b8f:
  if (!(bool)(str == (SQChar *)0x0 | bVar1) && (uVar2 & 1) != 0) {
    bVar3 = hasAnyPrefix(str,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)SQCompilationContext::function_should_return_bool_prefix_abi_cxx11_)
    ;
    bVar4 = true;
    if (!bVar3) {
      bVar4 = hasAnyPrefix(str,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)SQCompilationContext::
                                  function_should_return_something_prefix_abi_cxx11_);
    }
    if ((bVar4 == false) &&
       ((pcVar6 = strstr(str,"_ctor"), pcVar6 != (char *)0x0 ||
        (pcVar6 = strstr(str,"Ctor"), pcVar6 != (char *)0x0)))) {
      iVar5 = strncmp(str,"set",3);
      bVar4 = iVar5 != 0;
    }
    if (bVar4 != false) {
      report(this,(Node *)func,0x67,str);
    }
  }
  return;
}

Assistant:

void CheckerVisitor::checkFunctionReturns(FunctionDecl *func) {
  if (effectsOnly)
    return;

  const SQChar *name = func->name();

  if (!name || name[0] == '(') {
    name = findSlotNameInStack(func);
  }

  bool dummy;
  unsigned returnFlags = FunctionReturnTypeEvaluator(this).compute(func->body(), dummy);

  bool reported = false;

  if (returnFlags & ~(RT_BOOL | RT_UNRECOGNIZED | RT_FUNCTION_CALL | RT_NULL)) { // Null is castable to boolean
    if (nameLooksLikeResultMustBeBoolean(name)) {
      report(func, DiagnosticsId::DI_NAME_RET_BOOL, name);
      reported = true;
    }
  }

  if (!!(returnFlags & RT_NOTHING) &&
    !!(returnFlags & (RT_NUMBER | RT_STRING | RT_TABLE | RT_CLASS | RT_ARRAY | RT_CLOSURE | RT_UNRECOGNIZED | RT_THROW)))
  {
    if ((returnFlags & RT_THROW) == 0)
      report(func, DiagnosticsId::DI_NOT_ALL_PATH_RETURN_VALUE);
    reported = true;
  }
  else if (returnFlags)
  {
    unsigned flagsDiff = returnFlags & ~(RT_THROW | RT_NOTHING | RT_NULL | RT_UNRECOGNIZED | RT_FUNCTION_CALL);
    if (flagsDiff)
    {
      bool powerOfTwo = !(flagsDiff & (flagsDiff - 1));
      if (!powerOfTwo)
      {
        report(func, DiagnosticsId::DI_RETURNS_DIFFERENT_TYPES);
        reported = true;
      }
    }
  }

  if (!reported) {
    if (!!(returnFlags & RT_NOTHING) && nameLooksLikeFunctionMustReturnResult(name)) {
      report(func, DiagnosticsId::DI_NAME_EXPECTS_RETURN, name);
    }
  }
}